

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<TFad<6,_double>_>::Subst_Diag
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t c;
  long lVar2;
  int64_t r;
  long lVar3;
  TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> local_100;
  TFad<6,_double> local_f0;
  TFad<6,_double> local_b0;
  TFad<6,double> local_70 [64];
  
  lVar3 = (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar3 != CONCAT44(extraout_var,iVar1)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  lVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar1) <= lVar3) break;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
              (&local_f0,this,lVar3,lVar3);
    for (lVar2 = 0; lVar2 < (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol;
        lVar2 = lVar2 + 1) {
      (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(&local_b0,B,lVar3,lVar2);
      local_100.fadexpr_.right_ = &local_f0;
      local_100.fadexpr_.left_ = &local_b0;
      TFad<6,double>::TFad<TFadBinaryDiv<TFad<6,double>,TFad<6,double>>>(local_70,&local_100);
      (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(B,lVar3,lVar2,local_70);
    }
    lVar3 = lVar3 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}